

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_convolve_x_sr_c(uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
                        InterpFilterParams *filter_params_x,int subpel_x_qn,
                        ConvolveParams *conv_params)

{
  ushort uVar1;
  uint8_t uVar2;
  int16_t *piVar3;
  byte bVar4;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int k;
  int32_t res;
  int x;
  int y;
  int16_t *x_filter;
  long in_stack_00000018;
  int bits;
  int fo_horiz;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  
  uVar1 = _x->taps;
  bVar4 = 7 - (char)*(undefined4 *)(in_stack_00000018 + 0x14);
  piVar3 = av1_get_interp_filter_subpel_kernel(_x,(uint)x_filter & 0xf);
  for (local_3c = 0; local_3c < in_R9D; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < in_R8D; local_40 = local_40 + 1) {
      local_44 = 0;
      for (local_48 = 0; local_48 < (int)(uint)_x->taps; local_48 = local_48 + 1) {
        local_44 = (int)piVar3[local_48] *
                   (uint)*(byte *)(in_RDI + (int)(((local_3c * in_ESI + local_40) - (uVar1 / 2 - 1))
                                                 + local_48)) + local_44;
      }
      uVar2 = clip_pixel((local_44 +
                          ((1 << ((byte)*(undefined4 *)(in_stack_00000018 + 0x14) & 0x1f)) >> 1) >>
                         ((byte)*(undefined4 *)(in_stack_00000018 + 0x14) & 0x1f)) +
                         ((1 << (bVar4 & 0x1f)) >> 1) >> (bVar4 & 0x1f));
      *(uint8_t *)(in_RDX + (local_3c * in_ECX + local_40)) = uVar2;
    }
  }
  return;
}

Assistant:

void av1_convolve_x_sr_c(const uint8_t *src, int src_stride, uint8_t *dst,
                         int dst_stride, int w, int h,
                         const InterpFilterParams *filter_params_x,
                         const int subpel_x_qn, ConvolveParams *conv_params) {
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bits = FILTER_BITS - conv_params->round_0;

  assert(bits >= 0);
  assert((FILTER_BITS - conv_params->round_1) >= 0 ||
         ((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS));

  // horizontal filter
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);

  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_x->taps; ++k) {
        res += x_filter[k] * src[y * src_stride + x - fo_horiz + k];
      }
      res = ROUND_POWER_OF_TWO(res, conv_params->round_0);
      dst[y * dst_stride + x] = clip_pixel(ROUND_POWER_OF_TWO(res, bits));
    }
  }
}